

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<unsigned_short,float>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          float *out_value)

{
  bool bVar1;
  ushort *puVar2;
  byte bVar3;
  ushort *puVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  float fVar8;
  
  uVar6 = *(uint *)&this->num_components_;
  bVar3 = out_num_components;
  if ((byte)uVar6 < out_num_components) {
    bVar3 = (byte)uVar6;
  }
  bVar7 = bVar3 == 0;
  if (bVar7) {
LAB_0011843a:
    if ((byte)uVar6 < out_num_components) {
      memset(out_value + (uVar6 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar6 & 0xff)) * 4 + 4);
    }
  }
  else {
    puVar4 = (ushort *)
             ((this->buffer_->data_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start +
             this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    puVar2 = (ushort *)
             (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar4 < puVar2) {
      bVar1 = this->normalized_;
      uVar5 = 1;
      do {
        fVar8 = (float)*puVar4;
        if ((bVar1 & 1U) != 0) {
          out_value[uVar5 - 1] = fVar8;
          fVar8 = fVar8 / 65535.0;
        }
        out_value[uVar5 - 1] = fVar8;
        uVar6 = *(uint *)&this->num_components_;
        bVar3 = (byte)uVar6;
        if (out_num_components <= (byte)uVar6) {
          bVar3 = out_num_components;
        }
        bVar7 = bVar3 <= uVar5;
        if (bVar7) goto LAB_0011843a;
        puVar4 = puVar4 + 1;
        uVar5 = uVar5 + 1;
      } while (puVar4 < puVar2);
    }
  }
  return bVar7;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }